

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O1

ImageFeatureType_ImageSizeRange * __thiscall
CoreML::Specification::ImageFeatureType::mutable_imagesizerange(ImageFeatureType *this)

{
  ulong uVar1;
  ImageFeatureType_ImageSizeRange *pIVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] != 0x1f) {
    clear_SizeFlexibility(this);
    this->_oneof_case_[0] = 0x1f;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pIVar2 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::ImageFeatureType_ImageSizeRange>(arena);
    (this->SizeFlexibility_).imagesizerange_ = pIVar2;
  }
  return (ImageFeatureType_ImageSizeRange *)(this->SizeFlexibility_).enumeratedsizes_;
}

Assistant:

inline ::CoreML::Specification::ImageFeatureType_ImageSizeRange* ImageFeatureType::mutable_imagesizerange() {
  ::CoreML::Specification::ImageFeatureType_ImageSizeRange* _msg = _internal_mutable_imagesizerange();
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ImageFeatureType.imageSizeRange)
  return _msg;
}